

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu384a.c
# Opt level: O3

void hal_vdpu384a_record_scaling_list
               (scalingFactor_t *pScalingFactor_out,scalingList_t *pScalingList)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  RK_U8 *pRVar7;
  long lVar8;
  scalingList_t *psVar9;
  BitputCtx_t bp;
  RK_U8 *local_68;
  BitputCtx_t local_50;
  
  mpp_set_bitput_ctx(&local_50,(RK_U64 *)pScalingFactor_out,0xaa);
  pRVar7 = pScalingList->sl[0][0] + 0xc;
  lVar5 = 0;
  do {
    lVar3 = -4;
    do {
      mpp_put_bits(&local_50,(ulong)pRVar7[lVar3 + -8],8);
      mpp_put_bits(&local_50,(ulong)pRVar7[lVar3 + -4],8);
      mpp_put_bits(&local_50,(ulong)pRVar7[lVar3],8);
      mpp_put_bits(&local_50,(ulong)pRVar7[lVar3 + 4],8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    lVar5 = lVar5 + 1;
    pRVar7 = pRVar7 + 0x40;
  } while (lVar5 != 6);
  local_68 = pScalingList->sl[1][0] + 0x18;
  lVar5 = 0;
  do {
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      lVar6 = 0;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        lVar6 = lVar6 + lVar3;
        lVar8 = -4;
        do {
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -0x14],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -0xc],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -4],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + 4],8);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
        lVar6 = 0x20;
        bVar1 = false;
      } while (bVar2);
      lVar3 = 4;
      bVar1 = false;
    } while (bVar4);
    lVar5 = lVar5 + 1;
    local_68 = local_68 + 0x40;
  } while (lVar5 != 6);
  local_68 = pScalingList->sl[2][0] + 0x18;
  lVar5 = 0;
  do {
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      lVar6 = 0;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        lVar6 = lVar6 + lVar3;
        lVar8 = -4;
        do {
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -0x14],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -0xc],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -4],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + 4],8);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
        lVar6 = 0x20;
        bVar1 = false;
      } while (bVar2);
      lVar3 = 4;
      bVar1 = false;
    } while (bVar4);
    lVar5 = lVar5 + 1;
    local_68 = local_68 + 0x40;
  } while (lVar5 != 6);
  local_68 = pScalingList->sl[3][0] + 0x18;
  lVar5 = 0;
  do {
    lVar3 = 0;
    bVar1 = true;
    do {
      bVar4 = bVar1;
      lVar6 = 0;
      bVar1 = true;
      do {
        bVar2 = bVar1;
        lVar6 = lVar6 + lVar3;
        lVar8 = -4;
        do {
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -0x14],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -0xc],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + -4],8);
          mpp_put_bits(&local_50,(ulong)local_68[lVar8 + lVar6 + 4],8);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0);
        lVar6 = 0x20;
        bVar1 = false;
      } while (bVar2);
      lVar3 = 4;
      bVar1 = false;
    } while (bVar4);
    lVar5 = lVar5 + 1;
    local_68 = local_68 + 0x40;
  } while (lVar5 != 6);
  lVar5 = 0;
  psVar9 = pScalingList;
  do {
    lVar3 = 0;
    do {
      mpp_put_bits(&local_50,(ulong)psVar9->sl[0][0][lVar3],8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x10);
    lVar5 = lVar5 + 1;
    psVar9 = (scalingList_t *)(psVar9->sl[0] + 1);
  } while (lVar5 != 6);
  lVar5 = 0;
  do {
    mpp_put_bits(&local_50,(ulong)pScalingList->sl_dc[0][lVar5],8);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  lVar5 = 0;
  do {
    mpp_put_bits(&local_50,(ulong)pScalingList->sl_dc[1][lVar5],8);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 6);
  mpp_put_align(&local_50,0x80,0);
  return;
}

Assistant:

void hal_vdpu384a_record_scaling_list(scalingFactor_t *pScalingFactor_out, scalingList_t *pScalingList)
{
    RK_S32 i;
    RK_U32 listId;
    BitputCtx_t bp;

    mpp_set_bitput_ctx(&bp, (RK_U64 *)pScalingFactor_out, 170); // 170*64bits

    //-------- following make it by hardware needed --------
    //sizeId == 0, block4x4
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_U8 *p_data = pScalingList->sl[0][listId];
        /* dump by block4x4, vectial direction */
        for (i = 0; i < 4; i++) {
            mpp_put_bits(&bp, p_data[i + 0], 8);
            mpp_put_bits(&bp, p_data[i + 4], 8);
            mpp_put_bits(&bp, p_data[i + 8], 8);
            mpp_put_bits(&bp, p_data[i + 12], 8);
        }
    }
    //sizeId == 1, block8x8
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[1][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 2, block16x16
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[2][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 3, blcok32x32
    for (listId = 0; listId < 6; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[3][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 0, block4x4, horiztion direction */
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_U8 *p_data = pScalingList->sl[0][listId];

        for (i = 0; i < 16; i++)
            mpp_put_bits(&bp, p_data[i], 8);
    }

    // dump dc value
    for (i = 0; i < SCALING_LIST_NUM; i++)//sizeId = 2, 16x16
        mpp_put_bits(&bp, pScalingList->sl_dc[0][i], 8);
    for (i = 0; i < SCALING_LIST_NUM; i++) //sizeId = 3, 32x32
        mpp_put_bits(&bp, pScalingList->sl_dc[1][i], 8);

    mpp_put_align(&bp, 128, 0);
}